

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *this,
          WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey,PropertyAttributes attributes,
          bool isInitialized,bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  unsigned_short propertyIndex;
  PropertyRecord *pPVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined7 in_register_00000081;
  WriteBarrierPtr<const_Js::PropertyRecord> local_50;
  WriteBarrierPtr<const_Js::PropertyRecord> *local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,attributes);
  iVar4 = *(int *)(this + 0xc);
  local_48 = propertyKey;
  if (0xfffe < iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fa,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar3) goto LAB_00df2c3a;
    *puVar5 = 0;
    iVar4 = *(int *)(this + 0xc);
  }
  propertyIndex = *(unsigned_short *)(this + 0x2a);
  if (iVar4 <= (int)(uint)propertyIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fb,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar3) {
LAB_00df2c3a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    propertyIndex = *(unsigned_short *)(this + 0x2a);
  }
  local_34 = (undefined4)CONCAT71(in_register_00000009,isInitialized);
  local_38 = (undefined4)CONCAT71(in_register_00000081,isFixed);
  if (propertyIndex != 0xffff) {
    *(unsigned_short *)(this + 0x2a) = propertyIndex + 1;
    pPVar1 = local_48->ptr;
    Memory::Recycler::WBSetBit((char *)&local_50);
    local_50.ptr = pPVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
    Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
              (this,propertyIndex,&local_50,(PropertyAttributes)local_3c,local_34._0_1_,
               local_38._0_1_,usedAsFixed,scriptContext);
    return;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready

        Add(::Math::PostInc(nextPropertyIndex), propertyKey, attributes, isInitialized, isFixed, usedAsFixed, scriptContext);
    }